

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::writePivots(HModel *this,char *suffix)

{
  pointer piVar1;
  pointer piVar2;
  long *plVar3;
  ostream *poVar4;
  long *plVar5;
  ulong uVar6;
  uint uVar7;
  string filename;
  ofstream output;
  long *local_270;
  long local_260;
  long lStack_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long *local_230;
  long local_228 [30];
  ios_base local_138 [264];
  
  std::operator+(&local_250,"z-",&this->modelName);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_250);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_228[1] = *plVar5;
    local_228[2] = plVar3[3];
    local_230 = local_228 + 1;
  }
  else {
    local_228[1] = *plVar5;
    local_230 = (long *)*plVar3;
  }
  local_228[0] = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_230);
  local_270 = &local_260;
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_260 = *plVar5;
    lStack_258 = plVar3[3];
  }
  else {
    local_260 = *plVar5;
    local_270 = (long *)*plVar3;
  }
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_230 != local_228 + 1) {
    operator_delete(local_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  std::ofstream::ofstream(&local_230,(char *)local_270,_S_out);
  piVar1 = (this->historyColumnIn).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar2 = (this->historyColumnIn).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_230,(this->modelName)._M_dataplus._M_p,
                      (this->modelName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  uVar7 = (uint)((ulong)((long)piVar1 - (long)piVar2) >> 2);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
  poVar4 = std::ostream::_M_insert<double>(this->totalTime);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  *(undefined8 *)((long)local_228 + local_230[-3]) = 0xc;
  if (0 < (int)uVar7) {
    uVar6 = 0;
    do {
      poVar4 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&local_230,
                          (this->historyColumnIn).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar6]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
      poVar4 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&local_230,
                          (this->historyColumnOut).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar6]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
      poVar4 = std::ostream::_M_insert<double>
                         ((this->historyAlpha).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar6]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      uVar6 = uVar6 + 1;
    } while ((uVar7 & 0x7fffffff) != uVar6);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)((long)&local_230 + _VTT[-3]) = _sqrt;
  std::filebuf::~filebuf((filebuf *)local_228);
  std::ios_base::~ios_base(local_138);
  if (local_270 != &local_260) {
    operator_delete(local_270);
  }
  return;
}

Assistant:

void HModel::writePivots(const char *suffix) {
    string filename = "z-" + modelName + "-" + suffix;
    ofstream output(filename.c_str());
    int count = historyColumnIn.size();
    output << modelName << " " << count << "\t" << totalTime << endl;
    output << setprecision(12);
    for (int i = 0; i < count; i++) {
        output << historyColumnIn[i] << "\t";
        output << historyColumnOut[i] << "\t";
        output << historyAlpha[i] << endl;
    }
    output.close();
}